

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O2

void __thiscall rsg::VaryingStore::~VaryingStore(VaryingStore *this)

{
  _Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_> *this_00;
  _Base_ptr p_Var1;
  _Self __tmp;
  
  for (p_Var1 = (this->m_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_values)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_00 = *(_Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_> **)(p_Var1 + 2);
    if (this_00 != (_Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_> *)0x0) {
      std::_Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>::~_Vector_base(this_00);
    }
    operator_delete(this_00,0x18);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*>_>_>
  ::clear(&(this->m_values)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rsg::VaryingStorage_*>_>_>
  ::~_Rb_tree(&(this->m_values)._M_t);
  return;
}

Assistant:

VaryingStore::~VaryingStore (void)
{
	for (map<string, VaryingStorage*>::iterator i = m_values.begin(); i != m_values.end(); i++)
		delete i->second;
	m_values.clear();
}